

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O1

AggregateFunction * duckdb::CountStarFun::GetFunction(void)

{
  LogicalType *return_type;
  AggregateFunction *in_RDI;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,BIGINT);
  AggregateFunction::NullaryAggregate<long,long,duckdb::CountStarFunction>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,return_type);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,0,
             (char *)(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                     _M_string_length,0x1dd5707);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
  in_RDI->window = CountStarFunction::Window<long>;
  return in_RDI;
}

Assistant:

AggregateFunction CountStarFun::GetFunction() {
	auto fun = AggregateFunction::NullaryAggregate<int64_t, int64_t, CountStarFunction>(LogicalType::BIGINT);
	fun.name = "count_star";
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	fun.window = CountStarFunction::Window<int64_t>;
	return fun;
}